

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree_test.cpp
# Opt level: O1

int main(void)

{
  undefined1 *puVar1;
  string *psVar2;
  CompositeNode *pCVar3;
  void *pvVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  size_type *psVar8;
  char *pcVar9;
  undefined1 local_7d8 [8];
  Building building;
  DataContext data;
  Sequence sequence [3];
  undefined1 local_508 [8];
  DoorAction walkToDoor;
  Select selector;
  Invert inverter [2];
  undefined1 local_3f0 [8];
  DoorAction walkThroughDoor;
  SetVar<Door> setVariable;
  GetStack<Door> getDoorStackFromBuilding;
  DoorAction openDoor;
  DoorAction unlockDoor;
  DoorAction smashDoor;
  DoorAction closeDoor;
  Pop<Door> popFromStack;
  IsNull<Door> isNull;
  Async async;
  RepeatUntil untilFail;
  Succeed succeeder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int *local_38;
  
  srand(0x2a);
  plVar6 = (long *)operator_new(0x38);
  plVar6[1] = (long)(plVar6 + 3);
  *(undefined4 *)(plVar6 + 3) = 0x65646f4e;
  plVar6[2] = 4;
  *(undefined1 *)((long)plVar6 + 0x1c) = 0;
  *(undefined2 *)(plVar6 + 5) = 0;
  *(undefined4 *)((long)plVar6 + 0x2c) = 3;
  *plVar6 = (long)&PTR__DecoratorNode_0010f570;
  ConcurrentStack<Door_*>::ConcurrentStack((ConcurrentStack<Door_*> *)&building.doors.field_0xe8,10)
  ;
  data.doors._232_8_ = 0;
  data.currentDoor = (Door *)0x0;
  Building::Building((Building *)local_7d8,5);
  puVar1 = &data.doors.field_0xe8;
  lVar7 = 0xd8;
  psVar8 = &sequence[0].super_CompositeNode.super_Node._name._M_string_length;
  do {
    psVar8[-2] = (size_type)psVar8;
    *(undefined4 *)psVar8 = 0x65646f4e;
    (((string *)(psVar8 + -1))->_M_dataplus)._M_p = (pointer)0x4;
    *(undefined1 *)((long)psVar8 + 4) = 0;
    *(undefined2 *)(psVar8 + 2) = 0;
    *(undefined4 *)((long)psVar8 + 0x14) = 3;
    psVar8[3] = 0;
    psVar8[4] = 0;
    psVar8[5] = 0;
    psVar8[-3] = (size_type)&PTR__CompositeNode_0010f628;
    psVar8 = psVar8 + 9;
    lVar7 = lVar7 + -0x48;
  } while (lVar7 != 0);
  selector.super_CompositeNode.super_Node._vptr_Node =
       (_func_int **)&selector.super_CompositeNode.super_Node._name._M_string_length;
  selector.super_CompositeNode.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  selector.super_CompositeNode.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  selector.super_CompositeNode.super_Node._name._M_string_length._4_1_ = 0;
  selector.super_CompositeNode.super_Node._name.field_2._8_2_ = 0;
  selector.super_CompositeNode.super_Node._name.field_2._12_4_ = 3;
  selector.super_CompositeNode.super_Node._dontSkip = false;
  selector.super_CompositeNode.super_Node._completed = false;
  selector.super_CompositeNode.super_Node._42_2_ = 0;
  selector.super_CompositeNode.super_Node._lastStatus = FAILURE;
  selector.super_CompositeNode.children.
  super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selector.super_CompositeNode.children.
  super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walkToDoor._80_8_ = &PTR__CompositeNode_0010f6a8;
  lVar7 = 0x70;
  psVar8 = &inverter[0].super_DecoratorNode.super_Node._name._M_string_length;
  do {
    psVar8[-2] = (size_type)psVar8;
    *(undefined4 *)psVar8 = 0x65646f4e;
    (((string *)(psVar8 + -1))->_M_dataplus)._M_p = (pointer)0x4;
    *(undefined1 *)((long)psVar8 + 4) = 0;
    *(undefined2 *)(psVar8 + 2) = 0;
    *(undefined4 *)((long)psVar8 + 0x14) = 3;
    psVar8[-3] = (size_type)&PTR__DecoratorNode_0010f6e8;
    psVar8 = psVar8 + 7;
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != 0);
  succeeder.super_DecoratorNode.super_Node._vptr_Node =
       (_func_int **)&succeeder.super_DecoratorNode.super_Node._name._M_string_length;
  succeeder.super_DecoratorNode.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  succeeder.super_DecoratorNode.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  succeeder.super_DecoratorNode.super_Node._name._M_string_length._4_1_ = 0;
  succeeder.super_DecoratorNode.super_Node._name.field_2._8_2_ = 0;
  succeeder.super_DecoratorNode.super_Node._name.field_2._12_4_ = 3;
  untilFail._56_8_ = &PTR__DecoratorNode_0010f728;
  psVar2 = &setVariable.super_Node._name;
  walkThroughDoor._80_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&walkThroughDoor.probabilityOfSuccess,"");
  untilFail.super_DecoratorNode.super_Node._vptr_Node =
       (_func_int **)&untilFail.super_DecoratorNode.super_Node._name._M_string_length;
  untilFail.super_DecoratorNode.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  untilFail.super_DecoratorNode.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  untilFail.super_DecoratorNode.super_Node._name._M_string_length._4_1_ = 0;
  untilFail.super_DecoratorNode.super_Node._name.field_2._8_2_ = 0;
  untilFail.super_DecoratorNode.super_Node._name.field_2._12_4_ = 3;
  async._statusPoolTime.__r = (rep)&PTR__DecoratorNode_0010f768;
  untilFail.super_DecoratorNode.child._0_4_ = 0;
  if ((string *)walkThroughDoor._80_8_ != psVar2) {
    operator_delete((void *)walkThroughDoor._80_8_);
  }
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._vptr_Node =
       (_func_int **)
       &getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name._M_string_length;
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name._M_string_length._0_4_ =
       0x65646f4e;
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name._M_string_length._4_1_ = 0;
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name.field_2._8_2_ = 0;
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name.field_2._12_4_ = 3;
  getDoorStackFromBuilding.super_StackNode<Door>.super_Node._40_8_ = &building.doors.field_0xe8;
  setVariable.object = (Door **)&PTR__Node_0010fc50;
  getDoorStackFromBuilding.super_StackNode<Door>.stack = (ConcurrentStack<Door_*> *)local_7d8;
  getDoorStackFromBuilding.obtainedStack = (ConcurrentStack<Door_*> *)0x0;
  popFromStack.super_StackNode<Door>.super_Node._vptr_Node =
       (_func_int **)&popFromStack.super_StackNode<Door>.super_Node._name._M_string_length;
  popFromStack.super_StackNode<Door>.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  popFromStack.super_StackNode<Door>.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  popFromStack.super_StackNode<Door>.super_Node._name._M_string_length._4_1_ = 0;
  popFromStack.super_StackNode<Door>.super_Node._name.field_2._8_2_ = 0;
  popFromStack.super_StackNode<Door>.super_Node._name.field_2._12_4_ = 3;
  closeDoor._80_8_ = &PTR__Node_0010fcd0;
  setVariable.mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)&data.currentDoor;
  setVariable.super_Node._vptr_Node = (_func_int **)&setVariable.super_Node._name._M_string_length;
  setVariable.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  setVariable.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  setVariable.super_Node._name._M_string_length._4_1_ = 0;
  setVariable.super_Node._name.field_2._8_2_ = 0;
  setVariable.super_Node._name.field_2._12_4_ = 3;
  walkThroughDoor._80_8_ = &PTR__Node_0010fd10;
  setVariable.super_Node._dontSkip = false;
  setVariable.super_Node._completed = false;
  setVariable.super_Node._42_2_ = 0;
  setVariable.super_Node._lastStatus = FAILURE;
  setVariable.mutex_.super___mutex_base._M_mutex.__align = 0;
  setVariable.mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  setVariable.mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  setVariable.mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  isNull.super_Node._vptr_Node = (_func_int **)&isNull.super_Node._name._M_string_length;
  isNull.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  isNull.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  isNull.super_Node._name._M_string_length._4_1_ = 0;
  isNull.super_Node._name.field_2._8_2_ = 0;
  isNull.super_Node._name.field_2._12_4_ = 3;
  popFromStack.item = (Door **)&PTR__Node_0010fd50;
  async.super_DecoratorNode.super_Node._vptr_Node =
       (_func_int **)&async.super_DecoratorNode.super_Node._name._M_string_length;
  async.super_DecoratorNode.super_Node._name._M_string_length._0_4_ = 0x65646f4e;
  async.super_DecoratorNode.super_Node._name._M_dataplus._M_p = (pointer)0x4;
  async.super_DecoratorNode.super_Node._name._M_string_length._4_1_ = 0;
  async.super_DecoratorNode.super_Node._name.field_2._8_2_ = 0;
  async.super_DecoratorNode.super_Node._name.field_2._12_4_ = 3;
  isNull.object = (Door **)&PTR__DecoratorNode_0010f7a8;
  async.super_DecoratorNode.child = (Node *)0xa;
  psVar2 = &openDoor.super_Node._name;
  setVariable.variable = (Door **)puVar1;
  getDoorStackFromBuilding.object = (Door *)psVar2;
  popFromStack.super_StackNode<Door>.super_Node._40_8_ =
       getDoorStackFromBuilding.super_StackNode<Door>.super_Node._40_8_;
  popFromStack.super_StackNode<Door>.stack = (ConcurrentStack<Door_*> *)puVar1;
  isNull.super_Node._40_8_ = setVariable.mutex_.super___mutex_base._M_mutex.__data.__list.__next;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&getDoorStackFromBuilding.object,"Walk to door","");
  DoorAction::DoorAction((DoorAction *)local_508,(string *)&getDoorStackFromBuilding.object,99);
  if ((string *)getDoorStackFromBuilding.object != psVar2) {
    operator_delete(getDoorStackFromBuilding.object);
  }
  psVar2 = &unlockDoor.super_Node._name;
  openDoor._80_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&openDoor.probabilityOfSuccess,"Open door","");
  DoorAction::DoorAction
            ((DoorAction *)&getDoorStackFromBuilding.object,(string *)&openDoor.probabilityOfSuccess
             ,0xc);
  if ((string *)openDoor._80_8_ != psVar2) {
    operator_delete((void *)openDoor._80_8_);
  }
  psVar2 = &smashDoor.super_Node._name;
  unlockDoor._80_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&unlockDoor.probabilityOfSuccess,"Unlock door","");
  DoorAction::DoorAction
            ((DoorAction *)&openDoor.probabilityOfSuccess,(string *)&unlockDoor.probabilityOfSuccess
             ,0x19);
  if ((string *)unlockDoor._80_8_ != psVar2) {
    operator_delete((void *)unlockDoor._80_8_);
  }
  psVar2 = &walkThroughDoor.super_Node._name;
  local_3f0 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"Smash door","");
  DoorAction::DoorAction((DoorAction *)&unlockDoor.probabilityOfSuccess,(string *)local_3f0,0x3c);
  if (local_3f0 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_3f0);
  }
  psVar2 = &closeDoor.super_Node._name;
  smashDoor._80_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&smashDoor.probabilityOfSuccess,"Walk through door","");
  DoorAction::DoorAction((DoorAction *)local_3f0,(string *)&smashDoor.probabilityOfSuccess,0x55);
  if ((string *)smashDoor._80_8_ != psVar2) {
    operator_delete((void *)smashDoor._80_8_);
  }
  succeeder.super_DecoratorNode.child = (Node *)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&succeeder.super_DecoratorNode.child,"Close door","");
  DoorAction::DoorAction
            ((DoorAction *)&smashDoor.probabilityOfSuccess,
             (string *)&succeeder.super_DecoratorNode.child,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)succeeder.super_DecoratorNode.child != &local_48) {
    operator_delete(succeeder.super_DecoratorNode.child);
  }
  plVar6[6] = (long)&data.usedDoor;
  succeeder.super_DecoratorNode.child = (Node *)&setVariable.object;
  local_48._M_allocated_capacity =
       (size_type)
       &selector.super_CompositeNode.children.
        super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  lVar7 = 0;
  do {
    BehaviourTree::CompositeNode::addChild
              ((CompositeNode *)&data.usedDoor,
               *(Node **)((long)&succeeder.super_DecoratorNode.child + lVar7));
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  pCVar3 = (CompositeNode *)
           &sequence[0].super_CompositeNode.children.
            super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  inverter[0].super_DecoratorNode.super_Node._40_8_ = &popFromStack.item;
  succeeder.super_DecoratorNode.child = (Node *)&closeDoor.probabilityOfSuccess;
  lVar7 = 0;
  untilFail.super_DecoratorNode.super_Node._40_8_ = pCVar3;
  do {
    BehaviourTree::CompositeNode::addChild
              (pCVar3,*(Node **)((long)&succeeder.super_DecoratorNode.child + lVar7));
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  inverter[1].super_DecoratorNode.super_Node._40_8_ = &isNull.object;
  pCVar3 = (CompositeNode *)
           &sequence[1].super_CompositeNode.children.
            super__Vector_base<BehaviourTree::Node_*,_std::allocator<BehaviourTree::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  succeeder.super_DecoratorNode.child = (Node *)local_508;
  local_48._M_allocated_capacity = (size_type)local_3f0;
  local_48._8_8_ = &untilFail._exitStatus;
  local_38 = &walkThroughDoor.probabilityOfSuccess;
  lVar7 = 0;
  async.super_DecoratorNode.super_Node._40_8_ = pCVar3;
  do {
    BehaviourTree::CompositeNode::addChild
              (pCVar3,*(Node **)((long)&succeeder.super_DecoratorNode.child + lVar7));
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x28);
  succeeder.super_DecoratorNode.child = (Node *)&getDoorStackFromBuilding.object;
  local_48._M_allocated_capacity = (size_type)&unlockDoor.probabilityOfSuccess;
  lVar7 = 0;
  do {
    BehaviourTree::CompositeNode::addChild
              ((CompositeNode *)&walkToDoor.probabilityOfSuccess,
               *(Node **)((long)&succeeder.super_DecoratorNode.child + lVar7));
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  succeeder.super_DecoratorNode.super_Node._40_8_ = &smashDoor.probabilityOfSuccess;
  iVar5 = (**(code **)(*plVar6 + 0x10))(plVar6);
  pcVar9 = "Sorry.  You have failed to enter the building.";
  if (iVar5 == 1) {
    pcVar9 = "Congratulations!  You made it into the building!";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar9,(ulong)(iVar5 == 1) * 2 + 0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  smashDoor._80_8_ = &PTR__DoorAction_0010fc10;
  if ((size_type *)closeDoor.super_Node._40_8_ != &closeDoor.name._M_string_length) {
    operator_delete((void *)closeDoor.super_Node._40_8_);
  }
  smashDoor._80_8_ = &PTR__Node_0010f600;
  if (closeDoor.super_Node._vptr_Node != (_func_int **)&closeDoor.super_Node._name._M_string_length)
  {
    operator_delete(closeDoor.super_Node._vptr_Node);
  }
  local_3f0 = (undefined1  [8])&PTR__DoorAction_0010fc10;
  if ((size_type *)walkThroughDoor.super_Node._40_8_ != &walkThroughDoor.name._M_string_length) {
    operator_delete((void *)walkThroughDoor.super_Node._40_8_);
  }
  local_3f0 = (undefined1  [8])&PTR__Node_0010f600;
  if (walkThroughDoor.super_Node._vptr_Node !=
      (_func_int **)&walkThroughDoor.super_Node._name._M_string_length) {
    operator_delete(walkThroughDoor.super_Node._vptr_Node);
  }
  unlockDoor._80_8_ = &PTR__DoorAction_0010fc10;
  if ((size_type *)smashDoor.super_Node._40_8_ != &smashDoor.name._M_string_length) {
    operator_delete((void *)smashDoor.super_Node._40_8_);
  }
  unlockDoor._80_8_ = &PTR__Node_0010f600;
  if (smashDoor.super_Node._vptr_Node != (_func_int **)&smashDoor.super_Node._name._M_string_length)
  {
    operator_delete(smashDoor.super_Node._vptr_Node);
  }
  openDoor._80_8_ = &PTR__DoorAction_0010fc10;
  if ((size_type *)unlockDoor.super_Node._40_8_ != &unlockDoor.name._M_string_length) {
    operator_delete((void *)unlockDoor.super_Node._40_8_);
  }
  openDoor._80_8_ = &PTR__Node_0010f600;
  if (unlockDoor.super_Node._vptr_Node !=
      (_func_int **)&unlockDoor.super_Node._name._M_string_length) {
    operator_delete(unlockDoor.super_Node._vptr_Node);
  }
  getDoorStackFromBuilding.object = (Door *)&PTR__DoorAction_0010fc10;
  if ((size_type *)openDoor.super_Node._40_8_ != &openDoor.name._M_string_length) {
    operator_delete((void *)openDoor.super_Node._40_8_);
  }
  getDoorStackFromBuilding.object = (Door *)&PTR__Node_0010f600;
  if (openDoor.super_Node._vptr_Node != (_func_int **)&openDoor.super_Node._name._M_string_length) {
    operator_delete(openDoor.super_Node._vptr_Node);
  }
  local_508 = (undefined1  [8])&PTR__DoorAction_0010fc10;
  if ((size_type *)walkToDoor.super_Node._40_8_ != &walkToDoor.name._M_string_length) {
    operator_delete((void *)walkToDoor.super_Node._40_8_);
  }
  local_508 = (undefined1  [8])&PTR__Node_0010f600;
  if (walkToDoor.super_Node._vptr_Node !=
      (_func_int **)&walkToDoor.super_Node._name._M_string_length) {
    operator_delete(walkToDoor.super_Node._vptr_Node);
  }
  if (async.super_DecoratorNode.super_Node._40_8_ != 0) {
    async.super_DecoratorNode.super_Node._dontSkip = false;
    async.super_DecoratorNode.super_Node._completed = false;
    async.super_DecoratorNode.super_Node._42_2_ = 0;
    async.super_DecoratorNode.super_Node._lastStatus = FAILURE;
  }
  isNull.object = (Door **)&PTR__Node_0010f600;
  if (async.super_DecoratorNode.super_Node._vptr_Node !=
      (_func_int **)&async.super_DecoratorNode.super_Node._name._M_string_length) {
    operator_delete(async.super_DecoratorNode.super_Node._vptr_Node);
  }
  popFromStack.item = (Door **)&PTR__Node_0010f600;
  if (isNull.super_Node._vptr_Node != (_func_int **)&isNull.super_Node._name._M_string_length) {
    operator_delete(isNull.super_Node._vptr_Node);
  }
  walkThroughDoor._80_8_ = &PTR__Node_0010f600;
  if (setVariable.super_Node._vptr_Node !=
      (_func_int **)&setVariable.super_Node._name._M_string_length) {
    operator_delete(setVariable.super_Node._vptr_Node);
  }
  closeDoor._80_8_ = &PTR__Node_0010f600;
  if (popFromStack.super_StackNode<Door>.super_Node._vptr_Node !=
      (_func_int **)&popFromStack.super_StackNode<Door>.super_Node._name._M_string_length) {
    operator_delete(popFromStack.super_StackNode<Door>.super_Node._vptr_Node);
  }
  setVariable.object = (Door **)&PTR__Node_0010f600;
  if (getDoorStackFromBuilding.super_StackNode<Door>.super_Node._vptr_Node !=
      (_func_int **)
      &getDoorStackFromBuilding.super_StackNode<Door>.super_Node._name._M_string_length) {
    operator_delete(getDoorStackFromBuilding.super_StackNode<Door>.super_Node._vptr_Node);
  }
  if (untilFail.super_DecoratorNode.super_Node._40_8_ != 0) {
    untilFail.super_DecoratorNode.super_Node._dontSkip = false;
    untilFail.super_DecoratorNode.super_Node._completed = false;
    untilFail.super_DecoratorNode.super_Node._42_2_ = 0;
    untilFail.super_DecoratorNode.super_Node._lastStatus = FAILURE;
  }
  async._statusPoolTime.__r = (rep)&PTR__Node_0010f600;
  if (untilFail.super_DecoratorNode.super_Node._vptr_Node !=
      (_func_int **)&untilFail.super_DecoratorNode.super_Node._name._M_string_length) {
    operator_delete(untilFail.super_DecoratorNode.super_Node._vptr_Node);
  }
  if (succeeder.super_DecoratorNode.super_Node._40_8_ != 0) {
    succeeder.super_DecoratorNode.super_Node._dontSkip = false;
    succeeder.super_DecoratorNode.super_Node._completed = false;
    succeeder.super_DecoratorNode.super_Node._42_2_ = 0;
    succeeder.super_DecoratorNode.super_Node._lastStatus = FAILURE;
  }
  untilFail._56_8_ = &PTR__Node_0010f600;
  if (succeeder.super_DecoratorNode.super_Node._vptr_Node !=
      (_func_int **)&succeeder.super_DecoratorNode.super_Node._name._M_string_length) {
    operator_delete(succeeder.super_DecoratorNode.super_Node._vptr_Node);
  }
  lVar7 = 0;
  do {
    *(undefined ***)((long)&inverter[0].super_DecoratorNode.child + lVar7) =
         &PTR__DecoratorNode_0010f5d8;
    if (*(long *)(&inverter[1].super_DecoratorNode.super_Node._dontSkip + lVar7) != 0) {
      *(undefined8 *)(&inverter[1].super_DecoratorNode.super_Node._dontSkip + lVar7) = 0;
    }
    *(undefined ***)((long)&inverter[0].super_DecoratorNode.child + lVar7) = &PTR__Node_0010f600;
    pvVar4 = *(void **)((long)&inverter[1].super_DecoratorNode.super_Node._vptr_Node + lVar7);
    if ((void *)((long)&inverter[1].super_DecoratorNode.super_Node._name._M_string_length + lVar7)
        != pvVar4) {
      operator_delete(pvVar4);
    }
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != -0x70);
  BehaviourTree::CompositeNode::~CompositeNode((CompositeNode *)&walkToDoor.probabilityOfSuccess);
  lVar7 = 0x90;
  do {
    BehaviourTree::CompositeNode::~CompositeNode((CompositeNode *)((long)sequence + lVar7 + -8));
    lVar7 = lVar7 + -0x48;
  } while (lVar7 != -0x48);
  std::condition_variable::~condition_variable((condition_variable *)&building.doors.field_0xb8);
  std::condition_variable::~condition_variable
            ((condition_variable *)
             &building.doors.mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  std::_Deque_base<Door_*,_std::allocator<Door_*>_>::~_Deque_base
            ((_Deque_base<Door_*,_std::allocator<Door_*>_> *)local_7d8);
  std::condition_variable::~condition_variable((condition_variable *)&data.doors.field_0xb8);
  std::condition_variable::~condition_variable
            ((condition_variable *)
             &data.doors.mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  std::_Deque_base<Door_*,_std::allocator<Door_*>_>::~_Deque_base
            ((_Deque_base<Door_*,_std::allocator<Door_*>_> *)&building.doors.field_0xe8);
  return 0;
}

Assistant:

int main() {
	std::srand(42);

	BT behaviorTree;
	DataContext data;

	Building building(5);  // Building with 5 doors to get in.
	BT::Sequence sequence[3];
	BT::Select selector;
	BT::Invert inverter[2];
	BT::Succeed succeeder;
	BT::RepeatUntil untilFail("", BT::Status::FAILURE);
	BT::GetStack<Door> getDoorStackFromBuilding(data.doors, building.getDoors());
	BT::Pop<Door> popFromStack(data.currentDoor, data.doors);
	BT::SetVar<Door> setVariable(data.usedDoor, data.currentDoor);
	BT::IsNull<Door> isNull(data.usedDoor);
	BT::Async async;

	// Probabilities of success
	DoorAction walkToDoor("Walk to door", 99), 
		openDoor("Open door", 12), 
		unlockDoor("Unlock door", 25), 
		smashDoor("Smash door", 60), 
		walkThroughDoor("Walk through door", 85), 
		closeDoor("Close door", 100);

	// Build the tree (last diagram of
	// http://www.gamasutra.com/blogs/ChrisSimpson/20140717/221339/Behavior_trees_for_AI_How_they_work.php )
	behaviorTree.setRootChild(&sequence[0]);
	sequence[0].addChildren({ &getDoorStackFromBuilding, &untilFail, &inverter[0] });
	untilFail.setChild(&sequence[1]);
	inverter[0].setChild(&isNull);
	sequence[1].addChildren({ &popFromStack, &inverter[1] });
	inverter[1].setChild(&async);
	async.setChild(&sequence[2]);
	sequence[2].addChildren({ &walkToDoor, &selector, &walkThroughDoor, &succeeder, &setVariable });
	selector.addChildren({ &openDoor, &unlockDoor, &smashDoor });
	succeeder.setChild(&closeDoor);

	if (behaviorTree.run() == BT::Status::SUCCESS)
		std::cout << "Congratulations!  You made it into the building!" << std::endl;
	else
		std::cout << "Sorry.  You have failed to enter the building." << std::endl;
}